

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void flatbuffers::anon_unknown_0::SingleValueRepack<long>(Value *e,long val)

{
  string local_30;
  
  if ((e->type).base_type - BASE_TYPE_UTYPE < 10) {
    NumToString<long>(&local_30,val);
    std::__cxx11::string::operator=((string *)&e->constant,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

static inline void SingleValueRepack(Value &e, T val) {
  // Remove leading zeros.
  if (IsInteger(e.type.base_type)) { e.constant = NumToString(val); }
}